

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

bool google::protobuf::Base64UnescapeInternal(char *src,int slen,string *dest,char *unbase64)

{
  uint uVar1;
  LogMessage *other;
  undefined8 uVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar5 = slen + 3;
  if (-1 < slen) {
    iVar5 = slen;
  }
  iVar5 = slen - (iVar5 >> 2);
  pcVar4 = (char *)0x0;
  std::__cxx11::string::resize((ulong)dest,(char)iVar5);
  if (dest->_M_string_length != 0) {
    pcVar4 = (dest->_M_dataplus)._M_p;
  }
  uVar1 = Base64UnescapeInternal(src,slen,pcVar4,iVar5,unbase64);
  if ((int)uVar1 < 0) {
    dest->_M_string_length = 0;
    pcVar4 = (dest->_M_dataplus)._M_p;
  }
  else {
    if (iVar5 < (int)uVar1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x819);
      other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (len) <= (dest_len): ");
      internal::LogFinisher::operator=(&local_69,other);
      internal::LogMessage::~LogMessage(&local_68);
    }
    uVar3 = (ulong)uVar1;
    if (dest->_M_string_length < uVar3) {
      uVar2 = std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                         "basic_string::erase");
      internal::LogMessage::~LogMessage(&local_68);
      _Unwind_Resume(uVar2);
    }
    dest->_M_string_length = uVar3;
    pcVar4 = (dest->_M_dataplus)._M_p + uVar3;
  }
  *pcVar4 = '\0';
  return -1 < (int)uVar1;
}

Assistant:

static bool Base64UnescapeInternal(const char *src, int slen, std::string *dest,
                                   const signed char *unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  any leftover chars are added directly for good measure.
  // This is documented in the base64 RFC: http://tools.ietf.org/html/rfc3548
  const int dest_len = 3 * (slen / 4) + (slen % 4);

  dest->resize(dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  const int len = Base64UnescapeInternal(src, slen, string_as_array(dest),
                                         dest_len, unbase64);
  if (len < 0) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  GOOGLE_DCHECK_LE(len, dest_len);
  dest->erase(len);

  return true;
}